

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Isotope.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<32,_151>::Isotope::Isotope(Isotope *this,Isotope *param_1)

{
  double dVar1;
  
  this->lfw_ = param_1->lfw_;
  dVar1 = param_1->abn_;
  this->zai_ = param_1->zai_;
  this->abn_ = dVar1;
  std::
  vector<njoy::ENDFtk::section::Type<32,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ResonanceRange>_>
  ::vector(&this->ranges_,&param_1->ranges_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Isotope {

  /* fields */
  double zai_;
  double abn_;
  bool lfw_;
  std::vector< ResonanceRange > ranges_;

  /* auxiliary functions */
  #include "ENDFtk/section/32/151/Isotope/src/readScatteringRadiusCovariances.hpp"
  #include "ENDFtk/section/32/151/Isotope/src/readParameters.hpp"
  #include "ENDFtk/section/32/151/Isotope/src/readRanges.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/32/151/Isotope/src/ctor.hpp"

  /* get methods */

  /**
   *  @brief Return the ZA identifier of the isotope
   */
  double ZAI() const { return this->zai_; }

  /**
   *  @brief Return the abundance of the isotope
   */
  double ABN() const { return this->abn_; }

  /**
   *  @brief Return the abundance of the isotope
   */
  double abundance() const { return this->ABN(); }

  /**
   *  @brief Return the average fission flag
   */
  int LFW() const { return this->lfw_; }

  /**
   *  @brief Return the average fission flag
   */
  int averageFissionWidthFlag() const { return this->LFW(); }

  /**
   *  @brief Return the number of resonance ranges for this isotope
   */
  unsigned int NER() const { return this->ranges_.size(); }

  /**
   *  @brief Return the number of resonance ranges for this isotope
   */
  unsigned int numberResonanceRanges() const { return this->NER(); }

  /**
   *  @brief Return the resonance ranges for this isotope
   */
  auto resonanceRanges() const {

    return ranges::cpp20::views::all( this->ranges_ );
  }

  #include "ENDFtk/section/32/151/Isotope/src/print.hpp"
  #include "ENDFtk/section/32/151/Isotope/src/NC.hpp"
}